

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void __thiscall CVmObjTads::apply_undo(CVmObjTads *this,CVmUndoRecord *rec)

{
  ushort uVar1;
  vm_obj_id_t vVar2;
  char *pcVar3;
  ushort *puVar4;
  anon_union_8_8_cb74652f_for_val aVar5;
  ushort *puVar6;
  int iVar7;
  ushort *puVar8;
  vm_val_t *this_00;
  ushort *puVar9;
  
  pcVar3 = (this->super_CVmObject).ext_;
  uVar1 = (rec->id).prop;
  if (uVar1 == 0) {
    if ((rec->oldval).typ == VM_INT) {
      if ((rec->oldval).val.obj == 1) {
        pcVar3[10] = pcVar3[10] & 0xfd;
      }
    }
    else {
      this_00 = &rec->oldval;
      iVar7 = vm_val_t::is_listlike(this_00);
      if (iVar7 != 0) {
        iVar7 = vm_val_t::ll_length(this_00);
        change_superclass_list(this,this_00,iVar7);
        return;
      }
    }
  }
  else {
    for (puVar8 = *(ushort **)
                   (*(long *)(pcVar3 + 0x10) +
                   (ulong)((uint)uVar1 & *(int *)(pcVar3 + 0xc) - 1U) * 8);
        (puVar8 != (ushort *)0x0 && (*puVar8 != uVar1)); puVar8 = *(ushort **)(puVar8 + 4)) {
    }
    if (puVar8 != (ushort *)0x0) {
      aVar5 = (rec->oldval).val;
      *(undefined8 *)(puVar8 + 0xc) = *(undefined8 *)&rec->oldval;
      *(anon_union_8_8_cb74652f_for_val *)(puVar8 + 0x10) = aVar5;
      if ((rec->oldval).typ == VM_EMPTY) {
        vVar2 = (rec->oldval).val.obj;
        if (vVar2 == 1) {
          *(byte *)(puVar8 + 8) = (byte)puVar8[8] & 0xfe;
        }
        else if (vVar2 == 0) {
          puVar6 = (ushort *)
                   ((ulong)(((uint)(rec->id).prop & *(int *)(pcVar3 + 0xc) - 1U) << 3) +
                   *(long *)(pcVar3 + 0x10));
          do {
            puVar9 = puVar6;
            puVar4 = *(ushort **)puVar9;
            if (puVar4 == (ushort *)0x0) break;
            puVar6 = puVar4 + 4;
          } while (puVar4 != puVar8);
          if (puVar4 == puVar8) {
            *(undefined8 *)puVar9 = *(undefined8 *)(puVar8 + 4);
            *(short *)(pcVar3 + 0x22) = *(short *)(pcVar3 + 0x22) + -1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::apply_undo(VMG_ CVmUndoRecord *rec)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* 
     *   if the property is valid, it's a simple property change record;
     *   otherwise it's some other object-level change 
     */
    if (rec->id.prop == VM_INVALID_PROP)
    {
        /*
         *   Invalid property ID, so it's an object-level change:
         *   
         *   - int(1) -> object is newly modified (VMTO_OBJ_MOD flag was
         *   newly set)
         *   
         *   - list -> superclass list change
         */
        switch (rec->oldval.typ)
        {
        case VM_INT:
            switch (rec->oldval.val.intval)
            {
            case 1:
                /* VMTO_OBJ_MOD flag newly set - clear the flag */
                hdr->intern_obj_flags &= ~VMTO_OBJ_MOD;
                break;
            }
            break;

        default:
            /* check for a list, which indicates a superclass change */
            if (rec->oldval.is_listlike(vmg0_))
            {
                /* set the new superclass list */
                change_superclass_list(
                    vmg_ &rec->oldval, rec->oldval.ll_length(vmg0_));
            }
            break;
        }
    }
    else
    {
        /* find the property entry for the property being undone */
        vm_tadsobj_prop *entry = hdr->find_prop_entry(rec->id.prop);
        if (entry == 0)
        {
            /* can't find the property - something is out of whack */
            assert(FALSE);
            return;
        }
        
        /* restore the value from the record */
        entry->val = rec->oldval;
        
        /* if the old value is 'empty', it requires special handling */
        if (rec->oldval.typ == VM_EMPTY)
        {
            vm_tadsobj_prop *cur, **prv;
            unsigned int hash = hdr->calc_hash(rec->id.prop);
            
            /* 
             *   We use 'empty' records for multiple purposes, with the
             *   specific one indicated by the intval field. 
             */
            switch (rec->oldval.val.intval)
            {
            case 0:
                /*
                 *   Empty with intval 0 indicates a property addition, which
                 *   we undo by deleting the property.  First, find it in the
                 *   hash chain.  
                 */
                for (prv = &hdr->hash_arr[hash] ;
                     (cur = *prv) != 0 && cur != entry ;
                     prv = &cur->nxt) ;
                
                /* make sure we found it */
                if (cur == entry)
                {
                    /* unlink it */
                    *prv = entry->nxt;
                    
                    /* return it to the free list */
                    hdr->prop_entry_free -= 1;
                    assert(entry == &hdr->prop_entry_arr[hdr->prop_entry_free]);
                }
                else
                {
                    /* this should be impossible */
                    assert(FALSE);
                }
                break;
                
            case 1:
                /*
                 *   Empty with intval 1 indicates that we marked the slot as
                 *   newly modified, which we undo by clearing the modified
                 *   flag.
                 */
                entry->flags &= ~VMTO_PROP_MOD;
                break;
            }
        }
    }
}